

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O0

void start_watcher(uv_loop_t *loop,int signum,signal_ctx *ctx,int one_shot)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int one_shot_local;
  signal_ctx *ctx_local;
  int signum_local;
  uv_loop_t *loop_local;
  
  ctx->ncalls = 0;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->one_shot = one_shot;
  iVar1 = uv_signal_init(loop,&ctx->handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x90,"uv_signal_init(loop, &ctx->handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (one_shot == 0) {
    iVar1 = uv_signal_start(&ctx->handle,signal_cb,signum);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
              ,0x94,"uv_signal_start(&ctx->handle, signal_cb, signum)","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  else {
    iVar1 = uv_signal_start_oneshot(&ctx->handle,signal_cb_one_shot,signum);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
              ,0x92,"uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum)","==","0",
              (long)iVar1,"==",0);
      abort();
    }
  }
  return;
}

Assistant:

static void start_watcher(uv_loop_t* loop,
                          int signum,
                          struct signal_ctx* ctx,
                          int one_shot) {
  ctx->ncalls = 0;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->one_shot = one_shot;
  ASSERT_OK(uv_signal_init(loop, &ctx->handle));
  if (one_shot)
    ASSERT_OK(uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum));
  else
    ASSERT_OK(uv_signal_start(&ctx->handle, signal_cb, signum));
}